

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

Token * __thiscall Lexer::identifierOrKeyphrase(Token *__return_storage_ptr__,Lexer *this)

{
  byte bVar1;
  iterator iVar2;
  TokenType type;
  int iVar3;
  long lVar4;
  int iVar5;
  key_type kStack_48;
  
  iVar3 = 1;
  iVar5 = 1;
  lVar4 = 1;
  do {
    bVar1 = (this->source)._M_dataplus._M_p[lVar4 + this->start];
    if ((((byte)(bVar1 - 0x30) < 10) || (bVar1 == 0x5f)) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a))
    {
      if ((bVar1 < 0x2f) && ((0x400300000000U >> ((ulong)bVar1 & 0x3f) & 1) != 0))
      goto LAB_00103585;
    }
    else {
      if ((0x2e < bVar1) || ((0x400300000000U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
        std::__cxx11::string::substr((ulong)&kStack_48,(ulong)this);
        iVar2 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&tokenMap_abi_cxx11_._M_h,&kStack_48);
        std::__cxx11::string::~string((string *)&kStack_48);
        if (iVar2.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>,_true>
            ._M_cur == (__node_type *)0x0) {
          this->current = this->current + iVar5 + -1;
          type = IDENTIFIER;
        }
        else {
          this->current = this->current + (int)lVar4 + -1;
          type = *(TokenType *)
                  ((long)iVar2.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>,_true>
                         ._M_cur + 0x28);
        }
        makeToken(this,type);
        return __return_storage_ptr__;
      }
LAB_00103585:
      iVar3 = 0;
    }
    iVar5 = iVar5 + iVar3;
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

Token Lexer::identifierOrKeyphrase()
{
    bool oneWord = true;
    int keyphrase = 1;
    int id = 1;
    while (isAlpha(source[start + keyphrase])
        || isDigit(source[start + keyphrase])
        || isPunctuation(source[start + keyphrase]))
    {
        if (isPunctuation(source[start + keyphrase])) oneWord = false;
        if (oneWord) id++;
        keyphrase++;
    }

    auto search = tokenMap.find(source.substr(start, keyphrase));
    if (search != tokenMap.end())
    {
        current += keyphrase - 1;
        return makeToken(search->second);
    }
    else
    {
        current += id - 1;
        return makeToken(TokenType::IDENTIFIER);
    }
}